

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestMemoryAllocator.cpp
# Opt level: O0

void __thiscall GlobalMemoryAccountant::restoreMemoryAllocators(GlobalMemoryAccountant *this)

{
  TestMemoryAllocator *pTVar1;
  long in_RDI;
  
  pTVar1 = getCurrentMallocAllocator();
  if (pTVar1 == *(TestMemoryAllocator **)(in_RDI + 0x18)) {
    pTVar1 = AccountingTestMemoryAllocator::originalAllocator
                       (*(AccountingTestMemoryAllocator **)(in_RDI + 0x18));
    setCurrentMallocAllocator(pTVar1);
  }
  pTVar1 = getCurrentNewAllocator();
  if (pTVar1 == *(TestMemoryAllocator **)(in_RDI + 0x20)) {
    pTVar1 = AccountingTestMemoryAllocator::originalAllocator
                       (*(AccountingTestMemoryAllocator **)(in_RDI + 0x20));
    setCurrentNewAllocator(pTVar1);
  }
  pTVar1 = getCurrentNewArrayAllocator();
  if (pTVar1 == *(TestMemoryAllocator **)(in_RDI + 0x28)) {
    pTVar1 = AccountingTestMemoryAllocator::originalAllocator
                       (*(AccountingTestMemoryAllocator **)(in_RDI + 0x28));
    setCurrentNewArrayAllocator(pTVar1);
  }
  return;
}

Assistant:

void GlobalMemoryAccountant::restoreMemoryAllocators()
{
    if (getCurrentMallocAllocator() == mallocAllocator_)
        setCurrentMallocAllocator(mallocAllocator_->originalAllocator());

    if (getCurrentNewAllocator() == newAllocator_)
        setCurrentNewAllocator(newAllocator_->originalAllocator());

    if (getCurrentNewArrayAllocator() == newArrayAllocator_)
        setCurrentNewArrayAllocator(newArrayAllocator_->originalAllocator());
}